

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O1

bool __thiscall Loader::eraseFlash(Loader *this,string *loaderFile)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  char *pcVar6;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  timespec local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initializing FPGA...",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  pcVar1 = (loaderFile->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + loaderFile->_M_string_length);
  bVar2 = loadBin(this,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    bVar2 = Jtag::setFreq(this->device,1500000.0);
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Erasing...",10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      bVar2 = setIR(this,USER1);
      if (!bVar2) {
        return false;
      }
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"0","");
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
      bVar2 = shiftDR(this,1,&local_78,&local_98,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) {
        return false;
      }
      local_38.tv_sec = 1;
      local_38.tv_nsec = 0;
      do {
        iVar3 = nanosleep(&local_38,&local_38);
        if (iVar3 != -1) break;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
      bVar2 = setIR(this,JPROGRAM);
      if (!bVar2) {
        return false;
      }
      this->currentState = TEST_LOGIC_RESET;
      bVar2 = Jtag::navigateToState(this->device,CAPTURE_DR,TEST_LOGIC_RESET);
      return bVar2;
    }
    pcVar6 = "Failed to set JTAG frequency!";
    lVar5 = 0x1d;
  }
  else {
    pcVar6 = "Failed to initialize FPGA!";
    lVar5 = 0x1a;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  return false;
}

Assistant:

bool Loader::eraseFlash(string loaderFile) {
	cout << "Initializing FPGA..." << endl;
	if (!loadBin(loaderFile)) {
		cerr << "Failed to initialize FPGA!" << endl;
		return false;
	}

	if (!device->setFreq(1500000)) {
		cerr << "Failed to set JTAG frequency!" << endl;
		return false;
	}

	cout << "Erasing..." << endl;

	// Erase the flash
	if (!setIR(USER1))
		return false;

	if (!shiftDR(1, "0", "", ""))
		return false;

	std::this_thread::sleep_for(std::chrono::seconds(1)); // wait for erase

	if (!setIR(JPROGRAM))
		return false;

	// reset just for good measure
	if (!resetState())
		return false;

	return true;
}